

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall clask::server_t::parse_tree(server_t *this,node *n,string *s,func_t *fn)

{
  char cVar1;
  node *pnVar2;
  pointer p_Var3;
  size_type sVar4;
  __type _Var5;
  long lVar6;
  vector<clask::_node,_std::allocator<clask::_node>_> *__range2;
  node *n_00;
  pointer p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sub;
  undefined1 local_f8 [32];
  size_type local_d8;
  char local_d0 [16];
  _Any_data local_c0;
  _Manager_type local_b0;
  _Invoker_type p_Stack_a8;
  _Any_data local_a0;
  _Manager_type local_90;
  _Invoker_type p_Stack_88;
  _Any_data local_80;
  _Manager_type local_70;
  _Invoker_type p_Stack_68;
  bool local_60;
  string local_50;
  
  lVar6 = std::__cxx11::string::find((char)s,0x2f);
  cVar1 = (s->_M_dataplus)._M_p[1];
  if (lVar6 == -1) {
    std::__cxx11::string::substr((ulong)&sub,(ulong)s);
    p_Var7 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var3 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      sVar4 = sub._M_string_length;
      if (p_Var7 == p_Var3) {
        local_f8._24_8_ = local_d0;
        local_f8._0_8_ = (pointer)0x0;
        local_f8._8_8_ = (pointer)0x0;
        local_f8._16_8_ = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sub._M_dataplus._M_p == &sub.field_2) {
          local_d0[8] = sub.field_2._8_1_;
          local_d0[9] = sub.field_2._9_1_;
          local_d0[10] = sub.field_2._10_1_;
          local_d0[0xb] = sub.field_2._11_1_;
          local_d0[0xc] = sub.field_2._12_1_;
          local_d0[0xd] = sub.field_2._13_1_;
          local_d0[0xe] = sub.field_2._14_1_;
          local_d0[0xf] = sub.field_2._15_1_;
        }
        else {
          local_f8._24_8_ = sub._M_dataplus._M_p;
        }
        sub._M_string_length = 0;
        local_d8 = sVar4;
        sub.field_2._M_local_buf[0] = '\0';
        sub._M_dataplus._M_p = (pointer)&sub.field_2;
        _func_t::_func_t((_func_t *)&local_c0,fn);
        local_60 = cVar1 == ':';
        std::vector<clask::_node,std::allocator<clask::_node>>::emplace_back<clask::_node&>
                  ((vector<clask::_node,std::allocator<clask::_node>> *)n,(_node *)local_f8);
        goto LAB_001080a5;
      }
      _Var5 = std::operator==(&p_Var7->name,&sub);
      p_Var7 = p_Var7 + 1;
    } while (!_Var5);
  }
  else {
    std::__cxx11::string::substr((ulong)&sub,(ulong)s);
    if (cVar1 == ':') {
      std::__cxx11::string::substr((ulong)local_f8,(ulong)&sub);
      std::__cxx11::string::operator=((string *)&sub,(string *)local_f8);
      std::__cxx11::string::~string((string *)local_f8);
    }
    pnVar2 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (n_00 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>.
                _M_impl.super__Vector_impl_data._M_start; n_00 != pnVar2; n_00 = n_00 + 1) {
      _Var5 = std::operator==(&n_00->name,&sub);
      if (_Var5) {
        std::__cxx11::string::substr((ulong)local_f8,(ulong)s);
        parse_tree(this,n_00,(string *)local_f8,fn);
        std::__cxx11::string::~string((string *)local_f8);
        goto LAB_001080af;
      }
    }
    local_f8._24_8_ = local_d0;
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_f8._16_8_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sub._M_dataplus._M_p == &sub.field_2) {
      local_d0[8] = sub.field_2._8_1_;
      local_d0[9] = sub.field_2._9_1_;
      local_d0[10] = sub.field_2._10_1_;
      local_d0[0xb] = sub.field_2._11_1_;
      local_d0[0xc] = sub.field_2._12_1_;
      local_d0[0xd] = sub.field_2._13_1_;
      local_d0[0xe] = sub.field_2._14_1_;
      local_d0[0xf] = sub.field_2._15_1_;
    }
    else {
      local_f8._24_8_ = sub._M_dataplus._M_p;
    }
    local_d8 = sub._M_string_length;
    sub._M_string_length = 0;
    sub.field_2._M_local_buf[0] = '\0';
    local_c0._M_unused._M_object = (void *)0x0;
    local_c0._8_8_ = 0;
    local_b0 = (_Manager_type)0x0;
    p_Stack_a8 = (_Invoker_type)0x0;
    local_a0._M_unused._M_object = (void *)0x0;
    local_a0._8_8_ = 0;
    local_90 = (_Manager_type)0x0;
    p_Stack_88 = (_Invoker_type)0x0;
    local_80._M_unused._M_object = (void *)0x0;
    local_80._8_8_ = 0;
    local_70 = (_Manager_type)0x0;
    p_Stack_68 = (_Invoker_type)0x0;
    sub._M_dataplus._M_p = (pointer)&sub.field_2;
    local_60 = cVar1 == ':';
    std::__cxx11::string::substr((ulong)&local_50,(ulong)s);
    parse_tree(this,(node *)local_f8,&local_50,fn);
    std::__cxx11::string::~string((string *)&local_50);
    std::vector<clask::_node,_std::allocator<clask::_node>_>::emplace_back<clask::_node>
              (&n->children,(_node *)local_f8);
LAB_001080a5:
    _node::~_node((_node *)local_f8);
  }
LAB_001080af:
  std::__cxx11::string::~string((string *)&sub);
  return;
}

Assistant:

inline void server_t::parse_tree(node& n, const std::string& s, const func_t& fn) {
  auto pos = s.find('/', 1);
  auto placeholder = s[1] == ':';
  if (pos == std::string::npos) {
    bool found = false;
    auto sub = s.substr(placeholder ? 2 : 1);
    for (auto& vv : n.children) {
      if (vv.name == sub) {
        found = true;
        break;
      }
    }
    if (!found) {
      node nn =  {
        .name = std::move(sub),
        .fn = fn,
        .placeholder = placeholder,
      };
      n.children.emplace_back(nn);
    }
    return;
  }
  auto sub = s.substr(1, pos - 1);
  if (placeholder) sub = sub.substr(1);
  bool found = false;
  for (auto& vv : n.children) {
    if (vv.name == sub) {
      found = true;
      parse_tree(vv, s.substr(pos), fn);
      break;
    }
  }
  if (!found) {
    node nn = {
      .name = std::move(sub),
      .placeholder = placeholder,
    };
    parse_tree(nn, s.substr(pos), fn);
    n.children.emplace_back(std::move(nn));
  }
}